

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter.h
# Opt level: O2

void __thiscall
spdlog::details::name_formatter::format
          (name_formatter *this,log_msg *msg,tm *param_2,memory_buffer *dest)

{
  memory_buffer *dest_00;
  string_view_t view;
  string_view_t view_00;
  scoped_pad p;
  scoped_pad sStack_38;
  
  if ((this->super_flag_formatter).padinfo_.width_ != 0) {
    dest_00 = dest;
    scoped_pad::scoped_pad
              (&sStack_38,msg->logger_name->_M_string_length,&(this->super_flag_formatter).padinfo_,
               dest);
    view._M_str = (char *)dest;
    view._M_len = (size_t)(msg->logger_name->_M_dataplus)._M_p;
    fmt_helper::append_string_view<500ul>
              ((fmt_helper *)msg->logger_name->_M_string_length,view,dest_00);
    scoped_pad::~scoped_pad(&sStack_38);
    return;
  }
  view_00._M_str = (char *)dest;
  view_00._M_len = (size_t)(msg->logger_name->_M_dataplus)._M_p;
  fmt_helper::append_string_view<500ul>
            ((fmt_helper *)msg->logger_name->_M_string_length,view_00,dest);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, fmt::memory_buffer &dest) override
    {
        if (padinfo_.enabled())
        {
            scoped_pad p(*msg.logger_name, padinfo_, dest);
            fmt_helper::append_string_view(*msg.logger_name, dest);
        }
        else
        {
            fmt_helper::append_string_view(*msg.logger_name, dest);
        }
    }